

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::program_binary(NegativeTestContext *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  GLuint program;
  GLuint program_00;
  TestError *this;
  long lVar2;
  GLint bufSize;
  GLsizei binaryLength;
  GLint linkStatus;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaryBuf;
  GLenum binaryFormat;
  ProgramSources sources;
  ShaderProgram srcProgram;
  GLint local_2d4;
  GLsizei local_2d0;
  GLint local_2cc;
  value_type local_2c8;
  value_type local_2a0;
  undefined1 local_280 [16];
  undefined1 local_270 [104];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  renderCtx = ctx->m_renderCtx;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8),&local_2a0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar2 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_2a0._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_2d0 = -1;
  local_2c8._M_dataplus._M_p = (pointer)0x0;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_allocated_capacity = 0;
  local_2d4 = -1;
  local_2cc = -1;
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_100.m_program.m_program,0x8741,&local_2d4);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_100.m_program.m_program,0x8b82,&local_2cc);
  local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// GL_PROGRAM_BINARY_LENGTH = ",0x1e);
  std::ostream::operator<<(poVar1,local_2d4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_208);
  local_280._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar1 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// GL_LINK_STATUS = ",0x14);
  std::ostream::operator<<(poVar1,local_2cc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_208);
  if (-1 < (long)local_2d4) {
    if (local_2d4 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2c8,(long)local_2d4
                );
      glu::CallLogWrapper::glGetProgramBinary
                (&ctx->super_CallLogWrapper,local_100.m_program.m_program,local_2d4,&local_2d0,
                 (GLenum *)&local_2a0,local_2c8._M_dataplus._M_p);
      NegativeTestContext::expectError(ctx,0);
      local_280._0_8_ = (pointer)local_270;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,
                 "GL_INVALID_OPERATION is generated if program is not the name of an existing program object."
                 ,"");
      NegativeTestContext::beginSection(ctx,(string *)local_280);
      if ((pointer)local_280._0_8_ != (pointer)local_270) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
      }
      glu::CallLogWrapper::glProgramBinary
                (&ctx->super_CallLogWrapper,program_00,(GLenum)local_2a0._M_dataplus._M_p,
                 local_2c8._M_dataplus._M_p,local_2d0);
      NegativeTestContext::expectError(ctx,0x502);
      NegativeTestContext::endSection(ctx);
      local_280._0_8_ = (pointer)local_270;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,
                 "GL_INVALID_ENUM is generated if binaryFormat is not a value recognized by the implementation."
                 ,"");
      NegativeTestContext::beginSection(ctx,(string *)local_280);
      if ((pointer)local_280._0_8_ != (pointer)local_270) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
      }
      glu::CallLogWrapper::glProgramBinary
                (&ctx->super_CallLogWrapper,program,0xffffffff,local_2c8._M_dataplus._M_p,local_2d0)
      ;
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
    if (local_2c8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      local_2c8.field_2._M_allocated_capacity - (long)local_2c8._M_dataplus._M_p);
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"bufSize >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderApiTests.cpp"
             ,0x209);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void program_binary (NegativeTestContext& ctx)
{
	glu::ShaderProgram		srcProgram		(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	GLuint					dstProgram		= ctx.glCreateProgram();
	GLuint					dummyShader		= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLenum					binaryFormat	= -1;
	GLsizei					binaryLength	= -1;
	std::vector<deUint8>	binaryBuf;
	GLint					bufSize			= -1;
	GLint					linkStatus		= -1;

	ctx.glGetProgramiv		(srcProgram.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.glGetProgramiv		(srcProgram.getProgram(), GL_LINK_STATUS,			&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;

	TCU_CHECK(bufSize >= 0);
	if (bufSize > 0)
	{
		binaryBuf.resize(bufSize);
		ctx.glGetProgramBinary	(srcProgram.getProgram(), bufSize, &binaryLength, &binaryFormat, &binaryBuf[0]);
		ctx.expectError			(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if program is not the name of an existing program object.");
		ctx.glProgramBinary		(dummyShader, binaryFormat, &binaryBuf[0], binaryLength);
		ctx.expectError			(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_ENUM is generated if binaryFormat is not a value recognized by the implementation.");
		ctx.glProgramBinary		(dstProgram, -1, &binaryBuf[0], binaryLength);
		ctx.expectError			(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.glDeleteShader(dummyShader);
	ctx.glDeleteProgram(dstProgram);
}